

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowArrayStreamWrapper::GetSchema(ArrowArrayStreamWrapper *this,ArrowSchemaWrapper *schema)

{
  int iVar1;
  char *pcVar2;
  InvalidInputException *pIVar3;
  allocator local_62;
  allocator local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (*(this->arrow_array_stream).get_schema)(&this->arrow_array_stream,&schema->arrow_schema);
  if (iVar1 != 0) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_60,"arrow_scan: get_schema failed(): %s",&local_62);
    pcVar2 = (*(this->arrow_array_stream).get_last_error)(&this->arrow_array_stream);
    ::std::__cxx11::string::string((string *)&local_40,pcVar2,&local_61);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_60,&local_40);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((schema->arrow_schema).release != (_func_void_ArrowSchema_ptr *)0x0) {
    if (0 < (schema->arrow_schema).n_children) {
      return;
    }
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_60,"arrow_scan: empty schema passed",&local_62);
    InvalidInputException::InvalidInputException(pIVar3,&local_60);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_60,"arrow_scan: released schema passed",&local_62)
  ;
  InvalidInputException::InvalidInputException(pIVar3,&local_60);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ArrowArrayStreamWrapper::GetSchema(ArrowSchemaWrapper &schema) {
	D_ASSERT(arrow_array_stream.get_schema);
	// LCOV_EXCL_START
	if (arrow_array_stream.get_schema(&arrow_array_stream, &schema.arrow_schema)) {
		throw InvalidInputException("arrow_scan: get_schema failed(): %s", string(GetError()));
	}
	if (!schema.arrow_schema.release) {
		throw InvalidInputException("arrow_scan: released schema passed");
	}
	if (schema.arrow_schema.n_children < 1) {
		throw InvalidInputException("arrow_scan: empty schema passed");
	}
	// LCOV_EXCL_STOP
}